

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
HBF::heuristic_nhh_manhattan
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,HBF *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *grid,vector<int,_std::allocator<int>_> *goal)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer piVar3;
  long lVar4;
  pointer pvVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  int j;
  long lVar9;
  int iVar10;
  int iVar11;
  allocator_type local_52;
  allocator_type local_51;
  value_type_conflict1 local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  pvVar1 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (long)*(pointer *)
                    ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data + 8) -
             *(long *)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data >> 2,&local_50,&local_51);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,((long)pvVar2 - (long)pvVar1) / 0x18,(value_type *)&local_48,
           &local_52);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  pvVar1 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (lVar8 = 0; lVar8 != ((long)pvVar2 - (long)pvVar1) / 0x18; lVar8 = lVar8 + 1) {
    piVar3 = *(pointer *)
              ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data + 8);
    lVar4 = *(long *)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data;
    pvVar5 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (lVar9 = 0; (long)piVar3 - lVar4 >> 2 != lVar9; lVar9 = lVar9 + 1) {
      piVar6 = (goal->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      iVar10 = (int)lVar8 - piVar6[1];
      iVar7 = -iVar10;
      if (0 < iVar10) {
        iVar7 = iVar10;
      }
      iVar11 = (int)lVar9 - *piVar6;
      iVar10 = -iVar11;
      if (0 < iVar11) {
        iVar10 = iVar11;
      }
      *(double *)
       (*(long *)&pvVar5[lVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + lVar9 * 8) = (double)(iVar10 + iVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double> > HBF::heuristic_nhh_manhattan(vector<vector<int> > grid, vector<int> goal){
    /*
    Create the heuristic function for non-holonomic heuristic, which does not consider obstacles.
    A simple implementation that doesn't consider different trajectories at different points in cell.
    */

    vector<vector<double> > heuristic(grid.size(), vector<double>(grid[0].size(), 0));

    // give obstacles a very large value
    for (int i = 0; i < grid.size(); i ++){
        for (int j = 0; j < grid[0].size(); j ++){
            heuristic[i][j] = abs(i-goal[1])+abs(j-goal[0]);
        }
    }

    return heuristic;

}